

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QSimplexVariable_*,_double> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable*,double>>::findNode<QSimplexVariable*>
          (Data<QHashPrivate::Node<QSimplexVariable*,double>> *this,QSimplexVariable **key)

{
  byte bVar1;
  Node<QSimplexVariable_*,_double> *pNVar2;
  ulong uVar3;
  Bucket BVar4;
  
  uVar3 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  BVar4 = findBucketWithHash<QSimplexVariable*>
                    (this,key,uVar3 >> 0x20 ^ *(ulong *)(this + 0x18) ^ uVar3);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QSimplexVariable_*,_double> *)0x0;
  }
  else {
    pNVar2 = (Node<QSimplexVariable_*,_double> *)((BVar4.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }